

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

ParseTokenKind __thiscall TTD::TextFormatReader::ScanSpecialNumber(TextFormatReader *this)

{
  char16 cVar1;
  bool bVar2;
  char16 local_1a;
  char16 limitc;
  char16 signc;
  bool ok;
  char16 c;
  TextFormatReader *this_local;
  
  local_1a = L'\0';
  _limitc = this;
  bVar2 = FileReader::ReadRawChar(&this->super_FileReader,&local_1a);
  cVar1 = local_1a;
  if ((bVar2) && (local_1a == L'n')) {
    bVar2 = FileReader::ReadRawChar(&this->super_FileReader,&local_1a);
    if ((bVar2) && (local_1a == L'a')) {
      bVar2 = FileReader::ReadRawChar(&this->super_FileReader,&local_1a);
      if ((bVar2) && (local_1a == L'n')) {
        this_local._4_4_ = NaN;
      }
      else {
        this_local._4_4_ = Error;
      }
    }
    else {
      this_local._4_4_ = Error;
    }
  }
  else if ((bVar2) && ((local_1a == L'+' || (local_1a == L'-')))) {
    bVar2 = FileReader::ReadRawChar(&this->super_FileReader,&local_1a);
    if ((bVar2) && (local_1a == L'i')) {
      bVar2 = FileReader::ReadRawChar(&this->super_FileReader,&local_1a);
      if ((bVar2) && (local_1a == L'n')) {
        bVar2 = FileReader::ReadRawChar(&this->super_FileReader,&local_1a);
        if ((bVar2) && (local_1a == L'f')) {
          this_local._4_4_ = NegInfty;
          if (cVar1 == L'+') {
            this_local._4_4_ = PosInfty;
          }
        }
        else {
          this_local._4_4_ = Error;
        }
      }
      else {
        this_local._4_4_ = Error;
      }
    }
    else {
      this_local._4_4_ = Error;
    }
  }
  else if ((bVar2) && ((local_1a == L'u' || (local_1a == L'l')))) {
    bVar2 = FileReader::ReadRawChar(&this->super_FileReader,&local_1a);
    if ((bVar2) && (local_1a == L'b')) {
      this_local._4_4_ = LowerBound;
      if (cVar1 == L'u') {
        this_local._4_4_ = UpperBound;
      }
    }
    else {
      this_local._4_4_ = Error;
    }
  }
  else if ((bVar2) && (local_1a == L'e')) {
    bVar2 = FileReader::ReadRawChar(&this->super_FileReader,&local_1a);
    if ((bVar2) && (local_1a == L'p')) {
      this_local._4_4_ = Epsilon;
    }
    else {
      this_local._4_4_ = Error;
    }
  }
  else {
    this_local._4_4_ = Error;
  }
  return this_local._4_4_;
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::ScanSpecialNumber()
    {
        char16 c = _u('\0');
        bool ok = this->ReadRawChar(&c);

        if(ok && c == _u('n'))
        {
            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('a'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('n'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            return NSTokens::ParseTokenKind::NaN;
        }
        else if(ok && (c == _u('+') || c == _u('-')))
        {
            char16 signc = c;

            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('i'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('n'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('f'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            return (signc == _u('+')) ? NSTokens::ParseTokenKind::PosInfty : NSTokens::ParseTokenKind::NegInfty;
        }
        else if(ok && (c == _u('u') || c == _u('l')))
        {
            char16 limitc = c;

            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('b'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            return (limitc == _u('u')) ? NSTokens::ParseTokenKind::UpperBound : NSTokens::ParseTokenKind::LowerBound;
        }
        else if(ok && c == _u('e'))
        {
            ok = this->ReadRawChar(&c);
            if(!ok || c != _u('p'))
            {
                return NSTokens::ParseTokenKind::Error;
            }

            return NSTokens::ParseTokenKind::Epsilon;
        }
        else
        {
            return NSTokens::ParseTokenKind::Error;
        }
    }